

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O0

string * __thiscall cppcms::views::generator::name_abi_cxx11_(generator *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x30));
  return in_RDI;
}

Assistant:

std::string generator::name() const
{
	return name_;
}